

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O0

void reloc_hunk(GlobalVars *gv,FILE *f,LinkedSection *sec,uint32_t relhunk,uint8_t rtype,
               uint16_t rsize)

{
  node *pnVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  void *pvVar5;
  void *__ptr;
  void *pvVar6;
  node *pnVar7;
  char cVar8;
  int in_ECX;
  uint32_t uVar9;
  long in_RDX;
  long lVar10;
  long in_RDI;
  undefined4 in_R8D;
  short in_R9W;
  int n;
  int cnt;
  int newrcnt;
  RelocInsert *ri;
  int i;
  uint16_t rpos;
  lword rmask;
  lword chkmask;
  bool small_offsets;
  bool hunk_required;
  int *rcnt;
  list **rlist;
  Reloc *rel;
  Reloc *nextrel;
  uint32_t in_stack_ffffffffffffff6c;
  uint16_t w;
  int iVar11;
  uint32_t local_74;
  int local_60;
  ushort local_5a;
  ulong local_58;
  ulong local_50;
  node *local_30;
  
  cVar8 = (char)in_R8D;
  pnVar7 = *(node **)(in_RDX + 0x88);
  iVar11 = in_ECX;
  pvVar5 = alloc(CONCAT44(in_ECX,in_R8D));
  __ptr = alloczero(CONCAT44(iVar11,in_R8D));
  bVar2 = false;
  bVar3 = true;
  local_50 = (1L << ((byte)in_R9W & 0x3f)) - 1;
  local_5a = 0;
  for (local_60 = 0; local_60 < *(int *)(in_RDI + 0x1f0); local_60 = local_60 + 1) {
    pvVar6 = alloc(CONCAT44(iVar11,in_R8D));
    *(void **)((long)pvVar5 + (long)local_60 * 8) = pvVar6;
    initlist(*(list **)((long)pvVar5 + (long)local_60 * 8));
  }
  if (in_R9W == 0x18) {
    local_5a = 6;
    local_58 = 0x3ffffff;
    local_50 = 0x3fffffc;
  }
  else {
    local_58 = local_50;
    if (in_R9W == 0xe) {
      local_5a = 0x10;
      local_58 = 0xffff;
      local_50 = 0xfffc;
    }
  }
  while (local_30 = pnVar7, pnVar7 = local_30->next, pnVar7 != (node *)0x0) {
    if ((((*(char *)&local_30[3].pred == cVar8) &&
         (pnVar1 = local_30[3].next, pnVar1 != (node *)0x0)) &&
        (*(ushort *)&pnVar1->pred == local_5a)) &&
       ((*(short *)((long)&pnVar1->pred + 2) == in_R9W &&
        (((ulong)pnVar1[1].next & local_58) == local_50)))) {
      remnode(local_30);
      addtail(*(list **)((long)pvVar5 + (long)*(int *)&local_30[1].pred[1].next * 8),local_30);
      local_30[2].next =
           (node *)((long)&(local_30[2].next)->next + (long)((int)(uint)local_5a >> 3));
      lVar10 = (long)*(int *)&local_30[1].pred[1].next;
      iVar4 = *(int *)((long)__ptr + lVar10 * 4) + 1;
      *(int *)((long)__ptr + lVar10 * 4) = iVar4;
      if ((0xffff < iVar4) || ((node *)0xffff < local_30[2].next)) {
        bVar3 = false;
      }
      bVar2 = true;
    }
  }
  if (bVar2) {
    if ((((in_ECX == 0x3ec) && (*(char *)(in_RDI + 0x7a) == '\x04')) && (bVar3)) ||
       ((in_ECX == 0x3fd && (*(int *)(in_RDI + 0x5c) == 0)))) {
      bVar2 = false;
      if (bVar3) {
        fwrite32be((FILE *)CONCAT44(iVar11,in_R8D),in_stack_ffffffffffffff6c);
        for (local_60 = 0; w = (uint16_t)(in_stack_ffffffffffffff6c >> 0x10),
            local_60 < *(int *)(in_RDI + 0x1f0); local_60 = local_60 + 1) {
          if (*(int *)((long)__ptr + (long)local_60 * 4) != 0) {
            fwrite16be((FILE *)CONCAT44(iVar11,in_R8D),w);
            fwrite16be((FILE *)CONCAT44(iVar11,in_R8D),(uint16_t)(in_stack_ffffffffffffff6c >> 0x10)
                      );
            while (pnVar7 = remhead(*(list **)((long)pvVar5 + (long)local_60 * 8)),
                  pnVar7 != (node *)0x0) {
              fwrite16be((FILE *)CONCAT44(iVar11,in_R8D),
                         (uint16_t)(in_stack_ffffffffffffff6c >> 0x10));
              bVar2 = (bool)(bVar2 ^ 1);
            }
          }
        }
        if (bVar2) {
          fwrite16be((FILE *)CONCAT44(iVar11,in_R8D),w);
        }
        else {
          fwrite32be((FILE *)CONCAT44(iVar11,in_R8D),in_stack_ffffffffffffff6c);
        }
      }
      else {
        for (local_60 = 0; local_60 < *(int *)(in_RDI + 0x1f0); local_60 = local_60 + 1) {
          while (pnVar7 = remhead(*(list **)((long)pvVar5 + (long)local_60 * 8)),
                pnVar7 != (node *)0x0) {
            addtail((list *)(in_RDX + 0x88),pnVar7);
          }
        }
      }
    }
    else {
      fwrite32be((FILE *)CONCAT44(iVar11,in_R8D),in_stack_ffffffffffffff6c);
      for (local_60 = 0; local_60 < *(int *)(in_RDI + 0x1f0); local_60 = local_60 + 1) {
        while (*(int *)((long)__ptr + (long)local_60 * 4) != 0) {
          if (*(int *)((long)__ptr + (long)local_60 * 4) < 0x10001) {
            local_74 = *(uint32_t *)((long)__ptr + (long)local_60 * 4);
          }
          else {
            local_74 = 0x10000;
          }
          in_stack_ffffffffffffff6c = local_74;
          fwrite32be((FILE *)CONCAT44(iVar11,in_R8D),local_74);
          fwrite32be((FILE *)CONCAT44(iVar11,in_R8D),in_stack_ffffffffffffff6c);
          *(uint32_t *)((long)__ptr + (long)local_60 * 4) =
               *(int *)((long)__ptr + (long)local_60 * 4) - local_74;
          while (uVar9 = local_74 - 1, local_74 != 0) {
            pnVar7 = remhead(*(list **)((long)pvVar5 + (long)local_60 * 8));
            local_74 = uVar9;
            if (pnVar7 != (node *)0x0) {
              fwrite32be((FILE *)CONCAT44(iVar11,in_R8D),in_stack_ffffffffffffff6c);
            }
          }
        }
      }
      fwrite32be((FILE *)CONCAT44(iVar11,in_R8D),in_stack_ffffffffffffff6c);
    }
  }
  local_60 = 0;
  while (local_60 < *(int *)(in_RDI + 0x1f0)) {
    free(*(void **)((long)pvVar5 + (long)local_60 * 8));
    local_60 = local_60 + 1;
  }
  free(__ptr);
  return;
}

Assistant:

static void reloc_hunk(struct GlobalVars *gv,FILE *f,
                       struct LinkedSection *sec,uint32_t relhunk,
                       uint8_t rtype,uint16_t rsize)
/* generate an AmigaDOS/EHF relocation hunk for a specific reloc type */
{
  struct Reloc *nextrel,*rel=(struct Reloc *)sec->relocs.first;
  struct list **rlist=alloc(gv->nsecs*sizeof(struct list *));
  int *rcnt=alloczero(gv->nsecs*sizeof(int)); /* reloc cnt for all sect. */
  bool hunk_required=FALSE,small_offsets=TRUE;
  lword chkmask,rmask=makemask(rsize);
  uint16_t rpos=0;
  int i;

  for (i=0; i<gv->nsecs; i++) {  /* empty reloc lists for each section */
    rlist[i] = alloc(sizeof(struct list));
    initlist(rlist[i]);
  }

  /* EHF-PowerPC relocations need special treatment */
  if (rsize == 24) {
    rpos = 6;
    rmask = 0x3ffffff;
    chkmask = 0x3fffffc;
  }
  else if (rsize == 14) {
    rpos = 16;
    rmask = 0xffff;
    chkmask = 0xfffc;
  }
  else
    chkmask = rmask;

  while (nextrel = (struct Reloc *)rel->n.next) {
    struct RelocInsert *ri;
    int newrcnt;

    if (rel->rtype==rtype && (ri=rel->insert)!=NULL) {
      if (ri->bpos==rpos && ri->bsiz==rsize && (ri->mask&rmask)==chkmask) {
        /* move reloc node of correct type into relocssect's rlist */
        remnode(&rel->n);
        addtail(rlist[rel->relocsect.lnk->index],&rel->n);
        rel->offset += rpos >> 3;
        if (++rcnt[rel->relocsect.lnk->index] >= 0x10000 ||
            rel->offset >= 0x10000)
          small_offsets = FALSE; /* no short-reloc hunk would be possible */
        hunk_required = TRUE;
      }
    }
    rel = nextrel;
  }

  if (hunk_required) {  /* there's at least one relocation */

    if ((relhunk==HUNK_ABSRELOC32 &&
         gv->reloctab_format==RTAB_SHORTOFF && small_offsets) ||
        (relhunk==HUNK_RELRELOC32 && !gv->dest_object)) {
      /* Make a short hunk with 16-bit offsets.
         For executables, HUNK_DREL32 is used instead of the correct
         HUNK_RELOC32SHORT to be compatible with OS2.0.
         Due to a bug in OS3.x HUNK_RELRELOC32 requires 16-bit offsets
         in executables. */
      int cnt=0;

      if (!small_offsets) {
        /* cannot represent those relocs, so put them back */
        for (i=0; i<gv->nsecs; i++) {
          while (rel = (struct Reloc *)remhead(rlist[i]))
            addtail(&sec->relocs,&rel->n);
        }
        goto free_rlists;
      }
      if (!gv->dest_object && relhunk==HUNK_ABSRELOC32)
        relhunk = HUNK_DREL32;
      fwrite32be(f,relhunk);  /* reloc hunk id */

      for (i=0; i<gv->nsecs; i++) {
        if (rcnt[i]) {
          fwrite16be(f,(uint16_t)rcnt[i]);  /* number of relocations */
          fwrite16be(f,(uint16_t)i);  /* section index */
          cnt += 2;

          /* store relocation offsets */
          while (rel = (struct Reloc *)remhead(rlist[i])) {
            fwrite16be(f,(uint16_t)rel->offset);
            cnt++;
          }
        }
      }
      /* no more relocation entries */
      if (cnt & 1)  /* 0-word for 32-bit alignment */
        fwrite16be(f,0);
      else
        fwrite32be(f,0);
    }

    else {
      /* all other relocation hunks */
      fwrite32be(f,relhunk);  /* reloc hunk id */
      for (i=0; i<gv->nsecs; i++) {
        while (rcnt[i]) {
          /* never write more than 65536 relocs at once - there is a bug */
          /* in dos.library which rejects the executable file otherwise */
          int n = (rcnt[i]>0x10000) ? 0x10000 : rcnt[i];

          fwrite32be(f,(uint32_t)n);  /* number of relocations */
          fwrite32be(f,(uint32_t)i);  /* section index */
          rcnt[i] -= n;

          /* store relocation offsets */
          while (n--) {
            if (rel = (struct Reloc *)remhead(rlist[i])) {
              fwrite32be(f,(uint32_t)rel->offset);
            }
          }
        }
      }
      fwrite32be(f,0);  /* no more relocation entries */
    }
  }

  free_rlists:
  /* free dynamically allocated rlists and rcnt array */
  for (i=0; i<gv->nsecs; free(rlist[i++]));
  free(rcnt);
}